

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeNumber(ExpressionContext *ctx,SynNumber *syntax)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  ExprBase *pEVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ExprBase *extraout_RAX;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  TypeBase *pTVar10;
  char *pos;
  SynNumber *rhs;
  undefined8 uVar11;
  char *in_R9;
  char *pcVar12;
  __va_list_tag _Stack_120;
  undefined1 auStack_100 [32];
  undefined8 uStack_e0;
  char *pcStack_d8;
  code *pcStack_50;
  _func_int **local_40;
  undefined1 local_38 [16];
  undefined4 extraout_var;
  
  pcVar9 = (syntax->value).begin;
  uVar3 = (long)(syntax->value).end - (long)pcVar9;
  uVar7 = (uint)uVar3;
  if ((uVar7 < 2) || (pcVar9[1] != 'x')) {
    if (uVar7 != 0) {
      uVar8 = 0;
      bVar1 = false;
      do {
        if ((pcVar9[uVar8] == 'e') || (pcVar9[uVar8] == '.')) {
          bVar1 = true;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar3 & 0xffffffff) != uVar8);
      if (bVar1) {
        rhs = (SynNumber *)local_38;
        local_38._0_8_ = "f";
        local_38._8_8_ = "";
        pcStack_50 = (code *)0x1eeb2c;
        bVar1 = InplaceStr::operator==(&syntax->suffix,(InplaceStr *)rhs);
        if (bVar1) {
          pcStack_50 = (code *)0x1eeb3d;
          local_40 = (_func_int **)
                     anon_unknown.dwarf_11255e::ParseDouble
                               ((ExpressionContext *)(syntax->value).begin,(char *)rhs);
          pcStack_50 = (code *)0x1eeb55;
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
          pTVar10 = ctx->typeFloat;
          local_40 = (_func_int **)(double)(float)(double)local_40;
          pEVar5->typeID = 7;
          pEVar5->source = &syntax->super_SynBase;
          pEVar5->type = pTVar10;
          pEVar5->next = (ExprBase *)0x0;
          pEVar5->listed = false;
          pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6408;
        }
        else {
          pcVar9 = (syntax->suffix).begin;
          pcVar12 = (syntax->suffix).end;
          if (pcVar9 != pcVar12) {
            pcStack_50 = (code *)0x1eed6a;
            rhs = syntax;
            anon_unknown.dwarf_11255e::ReportAt
                      (ctx,&syntax->super_SynBase,pcVar9,"ERROR: unknown number suffix \'%.*s\'",
                       (ulong)(uint)((int)pcVar12 - (int)pcVar9),pcVar9);
          }
          pcStack_50 = (code *)0x1eed73;
          local_40 = (_func_int **)
                     anon_unknown.dwarf_11255e::ParseDouble
                               ((ExpressionContext *)(syntax->value).begin,(char *)rhs);
          pcStack_50 = (code *)0x1eed8b;
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar5 = (ExprBase *)CONCAT44(extraout_var_03,iVar2);
          pTVar10 = ctx->typeDouble;
          pEVar5->typeID = 7;
          pEVar5->source = &syntax->super_SynBase;
          pEVar5->type = pTVar10;
          pEVar5->next = (ExprBase *)0x0;
          pEVar5->listed = false;
          pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6408;
        }
        pEVar5[1]._vptr_ExprBase = local_40;
        return pEVar5;
      }
    }
    local_38._0_8_ = "b";
    local_38._8_8_ = "";
    pcStack_50 = (code *)0x1eebb9;
    bVar1 = InplaceStr::operator==(&syntax->suffix,(InplaceStr *)local_38);
    if (bVar1) {
      pcVar9 = (syntax->value).begin;
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        uVar7 = uVar6 + 1;
      } while (pcVar9[uVar6] == '0');
      if (0x40 < (int)(((*(int *)&(syntax->value).end - (int)pcVar9) - (uVar6 + 1)) + 1)) {
        pcStack_50 = (code *)0x1eebf1;
        anon_unknown.dwarf_11255e::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar9,"ERROR: overflow in binary constant");
      }
      pcVar12 = (syntax->value).begin + uVar6;
      pcVar9 = (syntax->value).end;
      iVar2 = 2;
    }
    else {
      local_38._0_8_ = "l";
      local_38._8_8_ = "";
      pcStack_50 = (code *)0x1eec51;
      bVar1 = InplaceStr::operator==(&syntax->suffix,(InplaceStr *)local_38);
      if (bVar1) {
        pcVar9 = (syntax->value).end;
        uVar11 = 10;
        pcStack_50 = (code *)0x1eec6e;
        pp_Var4 = (_func_int **)
                  anon_unknown.dwarf_11255e::ParseLong
                            (ctx,&syntax->super_SynBase,(syntax->value).begin,pcVar9,10);
        if ((long)pp_Var4 < 0) {
LAB_001eee33:
          pcStack_50 = anon_unknown.dwarf_11255e::ReportAt;
          anon_unknown.dwarf_11255e::StopAt(ctx,&syntax->super_SynBase,(syntax->value).begin,pcVar9)
          ;
          _Stack_120.reg_save_area = auStack_100;
          _Stack_120.overflow_arg_area = &local_40;
          _Stack_120.gp_offset = 0x20;
          _Stack_120.fp_offset = 0x30;
          uStack_e0 = uVar11;
          pcStack_d8 = in_R9;
          anon_unknown.dwarf_11255e::ReportAt(ctx,&syntax->super_SynBase,pos,pcVar9,&_Stack_120);
          return extraout_RAX;
        }
        pcStack_50 = (code *)0x1eec8c;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var_02,iVar2);
        goto LAB_001eec8c;
      }
      pcVar9 = (syntax->suffix).begin;
      pcVar12 = (syntax->suffix).end;
      if (pcVar9 != pcVar12) {
        pcStack_50 = (code *)0x1eecbf;
        anon_unknown.dwarf_11255e::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar9,"ERROR: unknown number suffix \'%.*s\'",
                   (ulong)(uint)((int)pcVar12 - (int)pcVar9));
        in_R9 = pcVar9;
      }
      pcVar12 = (syntax->value).begin;
      iVar2 = (int)(syntax->value).end;
      if ((((uint)(iVar2 - (int)pcVar12) < 2) || (*pcVar12 != '0')) ||
         (9 < (byte)(pcVar12[1] - 0x30U))) {
        pcVar9 = (syntax->value).end;
        uVar11 = 10;
        pcStack_50 = (code *)0x1eedd9;
        pp_Var4 = (_func_int **)
                  anon_unknown.dwarf_11255e::ParseLong(ctx,&syntax->super_SynBase,pcVar12,pcVar9,10)
        ;
        if ((_func_int **)(long)(int)pp_Var4 != pp_Var4) goto LAB_001eee33;
        pcStack_50 = (code *)0x1eedf6;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var_04,iVar2);
        goto LAB_001eedf6;
      }
      uVar7 = 0;
      do {
        uVar3 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
      } while (pcVar12[uVar3] == '0');
      iVar2 = iVar2 - (int)pcVar12;
      if ((0x16 < (int)((iVar2 - uVar7) + 1)) ||
         ((iVar2 - 0x15U == uVar7 && (pcVar12[uVar3] != '1')))) {
        pcStack_50 = (code *)0x1eed2a;
        anon_unknown.dwarf_11255e::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar12,"ERROR: overflow in octal constant");
      }
      pcVar12 = (syntax->value).begin;
      pcVar9 = (syntax->value).end;
      iVar2 = 8;
    }
    pcStack_50 = (code *)0x1eec0d;
    pp_Var4 = (_func_int **)
              anon_unknown.dwarf_11255e::ParseLong(ctx,&syntax->super_SynBase,pcVar12,pcVar9,iVar2);
    pcStack_50 = (code *)0x1eec25;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
    if ((_func_int **)(long)(int)pp_Var4 == pp_Var4) goto LAB_001eedf6;
  }
  else {
    if (uVar7 == 2) {
      pcStack_50 = (code *)0x1eea05;
      anon_unknown.dwarf_11255e::ReportAt
                (ctx,&syntax->super_SynBase,pcVar9 + 2,"ERROR: \'0x\' must be followed by number");
    }
    local_38._0_8_ = "l";
    local_38._8_8_ = "";
    pcStack_50 = (code *)0x1eea28;
    bVar1 = InplaceStr::operator==(&syntax->suffix,(InplaceStr *)local_38);
    if (!bVar1) {
      pcVar9 = (syntax->suffix).begin;
      pcVar12 = (syntax->suffix).end;
      if (pcVar9 != pcVar12) {
        pcStack_50 = (code *)0x1eea55;
        anon_unknown.dwarf_11255e::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar9,"ERROR: unknown number suffix \'%.*s\'",
                   (ulong)(uint)((int)pcVar12 - (int)pcVar9),pcVar9);
      }
    }
    pcVar9 = (syntax->value).begin;
    iVar2 = (int)pcVar9 + 1;
    uVar7 = 2;
    do {
      uVar6 = uVar7;
      iVar2 = iVar2 + 1;
      uVar7 = uVar6 + 1;
    } while (pcVar9[uVar6] == '0');
    if (0x10 < *(int *)&(syntax->value).end - iVar2) {
      pcStack_50 = (code *)0x1eea8d;
      anon_unknown.dwarf_11255e::ReportAt
                (ctx,&syntax->super_SynBase,pcVar9,"ERROR: overflow in hexadecimal constant");
    }
    pcStack_50 = (code *)0x1eeaa9;
    pp_Var4 = (_func_int **)
              anon_unknown.dwarf_11255e::ParseLong
                        (ctx,&syntax->super_SynBase,(syntax->value).begin + uVar6,
                         (syntax->value).end,0x10);
    pcStack_50 = (code *)0x1eeaca;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    if (!bVar1 && (_func_int **)(long)(int)pp_Var4 == pp_Var4) {
LAB_001eedf6:
      pTVar10 = ctx->typeInt;
      goto LAB_001eedfd;
    }
  }
LAB_001eec8c:
  pTVar10 = ctx->typeLong;
LAB_001eedfd:
  pEVar5->typeID = 6;
  pEVar5->source = &syntax->super_SynBase;
  pEVar5->type = pTVar10;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f63d0;
  pEVar5[1]._vptr_ExprBase = pp_Var4;
  return pEVar5;
}

Assistant:

ExprBase* AnalyzeNumber(ExpressionContext &ctx, SynNumber *syntax)
{
	InplaceStr &value = syntax->value;

	// Hexadecimal
	if(value.length() > 1 && value.begin[1] == 'x')
	{
		if(value.length() == 2)
			ReportAt(ctx, syntax, value.begin + 2, "ERROR: '0x' must be followed by number");

		bool forceLong = false;

		if(syntax->suffix == InplaceStr("l"))
			forceLong = true;
		else if(!syntax->suffix.empty())
			ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);

		// Skip 0x
		unsigned pos = 2;

		// Skip leading zeros
		while(value.begin[pos] == '0')
			pos++;

		if(int(value.length() - pos) > 16)
			ReportAt(ctx, syntax, value.begin, "ERROR: overflow in hexadecimal constant");

		long long num = (long long)ParseLong(ctx, syntax, value.begin + pos, value.end, 16);

		// If number overflows integer number, create long number
		if(!forceLong && int(num) == num)
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
	}

	bool isFP = false;

	for(unsigned i = 0; i < value.length(); i++)
	{
		if(value.begin[i] == '.' || value.begin[i] == 'e')
			isFP = true;
	}

	if(!isFP)
	{
		if(syntax->suffix == InplaceStr("b"))
		{
			unsigned pos = 0;

			// Skip leading zeros
			while(value.begin[pos] == '0')
				pos++;

			if(int(value.length() - pos) > 64)
				ReportAt(ctx, syntax, value.begin, "ERROR: overflow in binary constant");

			long long num = (long long)ParseLong(ctx, syntax, value.begin + pos, value.end, 2);

			// If number overflows integer number, create long number
			if(int(num) == num)
				return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
		}
		else if(syntax->suffix == InplaceStr("l"))
		{
			unsigned long long num = ParseLong(ctx, syntax, value.begin, value.end, 10);

			if(num > 9223372036854775807ull)
				StopAt(ctx, syntax, value.begin, "ERROR: overflow in integer constant");

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, (long long)num);
		}
		else if(!syntax->suffix.empty())
		{
			ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);
		}

		if(value.length() > 1 && value.begin[0] == '0' && isDigit(value.begin[1]))
		{
			unsigned pos = 0;

			// Skip leading zeros
			while(value.begin[pos] == '0')
				pos++;

			if(int(value.length() - pos) > 22 || (int(value.length() - pos) > 21 && value.begin[pos] != '1'))
				ReportAt(ctx, syntax, value.begin, "ERROR: overflow in octal constant");

			long long num = (long long)ParseLong(ctx,syntax,  value.begin, value.end, 8);

			// If number overflows integer number, create long number
			if(int(num) == num)
				return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
		}

		long long num = (long long)ParseLong(ctx, syntax, value.begin, value.end, 10);

		if(int(num) != num)
			StopAt(ctx, syntax, value.begin, "ERROR: overflow in integer constant");

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);
	}

	if(syntax->suffix == InplaceStr("f"))
	{
		double num = ParseDouble(ctx, value.begin);

		return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(syntax, ctx.typeFloat, float(num));
	}
	else if(!syntax->suffix.empty())
	{
		ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);
	}

	double num = ParseDouble(ctx, value.begin);

	return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(syntax, ctx.typeDouble, num);
}